

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_secp256k1.cpp
# Opt level: O2

void __thiscall
Secp256k1_CombinePubkeySecp256k1EcErrorCaseTest_Test::TestBody
          (Secp256k1_CombinePubkeySecp256k1EcErrorCaseTest_Test *this)

{
  void *pvVar1;
  pointer paVar2;
  bool bVar3;
  pointer paVar4;
  AssertHelper local_90;
  Secp256k1 secp;
  ByteData actual;
  CombinePubkeyTestVector test_vector;
  
  pvVar1 = (void *)wally_get_secp_context();
  cfd::core::Secp256k1::Secp256k1(&secp,pvVar1);
  paVar2 = combine_error_vectors.
           super__Vector_base<CombinePubkeyTestVector,_std::allocator<CombinePubkeyTestVector>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (paVar4 = combine_error_vectors.
                super__Vector_base<CombinePubkeyTestVector,_std::allocator<CombinePubkeyTestVector>_>
                ._M_impl.super__Vector_impl_data._M_start; paVar4 != paVar2; paVar4 = paVar4 + 1) {
    anon_struct_56_2_5c921040::CombinePubkeyTestVector(&test_vector,paVar4);
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::Secp256k1::CombinePubkeySecp256k1Ec((vector *)&actual);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&actual);
    }
    testing::Message::Message((Message *)&actual);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_secp256k1.cpp"
               ,0x9c,
               "Expected: ByteData actual = secp.CombinePubkeySecp256k1Ec(test_vector.pubkeys) throws an exception of type CfdException.\n  Actual: it throws nothing."
              );
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&actual);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&actual);
    anon_struct_56_2_5c921040::~CombinePubkeyTestVector(&test_vector);
  }
  return;
}

Assistant:

TEST(Secp256k1, CombinePubkeySecp256k1EcErrorCaseTest) {
  struct secp256k1_context_struct *cxt = wally_get_secp_context();
  Secp256k1 secp = Secp256k1(cxt);
  for (CombinePubkeyTestVector test_vector : combine_error_vectors) {
    EXPECT_THROW(
        ByteData actual = secp.CombinePubkeySecp256k1Ec(test_vector.pubkeys),
        CfdException);
  }
}